

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O0

ImmutableSamplerDesc * __thiscall
Diligent::FixedLinearAllocator::ConstructArray<Diligent::ImmutableSamplerDesc>
          (FixedLinearAllocator *this,size_t count)

{
  ImmutableSamplerDesc *pIVar1;
  ulong local_28;
  size_t i;
  ImmutableSamplerDesc *Ptr;
  size_t count_local;
  FixedLinearAllocator *this_local;
  
  pIVar1 = Allocate<Diligent::ImmutableSamplerDesc>(this,count);
  for (local_28 = 0; local_28 < count; local_28 = local_28 + 1) {
    ImmutableSamplerDesc::ImmutableSamplerDesc(pIVar1 + local_28);
  }
  return pIVar1;
}

Assistant:

NODISCARD T* ConstructArray(size_t count, const Args&... args)
    {
        T* Ptr = Allocate<T>(count);
        for (size_t i = 0; i < count; ++i)
        {
            new (Ptr + i) T{args...};
        }
        return Ptr;
    }